

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decReverse(uint8_t *ulo,uint8_t *uhi)

{
  uint8_t uVar1;
  uint8_t *puStack_18;
  uint8_t temp;
  uint8_t *uhi_local;
  uint8_t *ulo_local;
  
  puStack_18 = uhi;
  for (uhi_local = ulo; uhi_local < puStack_18; uhi_local = uhi_local + 1) {
    uVar1 = *uhi_local;
    *uhi_local = *puStack_18;
    *puStack_18 = uVar1;
    puStack_18 = puStack_18 + -1;
  }
  return;
}

Assistant:

static void decReverse(Unit *ulo, Unit *uhi) {
  Unit temp;
  for (; ulo<uhi; ulo++, uhi--) {
    temp=*ulo;
    *ulo=*uhi;
    *uhi=temp;
    }
  return;
  }